

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O0

int could_seduce(monst *magr,monst *mdef,attack *mattk)

{
  int iVar1;
  bool bVar2;
  char local_34;
  char local_33;
  bool local_31;
  xchar gendef;
  xchar genagr;
  boolean defperc;
  permonst *ppStack_30;
  boolean agrinvis;
  permonst *pagr;
  attack *mattk_local;
  monst *mdef_local;
  monst *magr_local;
  
  if ((magr->data->mflags1 & 0x40000) == 0) {
    if (magr == &youmonst) {
      ppStack_30 = youmonst.data;
      if ((((u.uprops[0xd].intrinsic != 0) || (u.uprops[0xd].extrinsic != 0)) ||
          (youmonst.data == mons + 0x9e)) || (local_31 = false, youmonst.data == mons + 0x7b)) {
        local_31 = u.uprops[0xd].blocked == 0;
      }
      iVar1 = poly_gender();
      local_33 = (char)iVar1;
    }
    else {
      ppStack_30 = magr->data;
      local_31 = (bool)((byte)(*(uint *)&magr->field_0x60 >> 1) & 1);
      iVar1 = gender(magr);
      local_33 = (char)iVar1;
    }
    if (mdef == &youmonst) {
      bVar2 = true;
      if ((u.uprops[0xc].intrinsic == 0) && (bVar2 = true, u.uprops[0xc].extrinsic == 0)) {
        bVar2 = ((youmonst.data)->mflags1 & 0x1000000) != 0;
      }
      iVar1 = poly_gender();
      local_34 = (char)iVar1;
    }
    else {
      bVar2 = (mdef->data->mflags1 & 0x1000000) != 0;
      iVar1 = gender(mdef);
      local_34 = (char)iVar1;
    }
    if (((local_31 == false) || (bVar2)) || ((mattk == (attack *)0x0 || (mattk->adtyp == '#')))) {
      if ((ppStack_30->mlet == '\x0e') ||
         (((ppStack_30 == mons + 0x130 || (ppStack_30 == mons + 0x12f)) &&
          ((mattk == (attack *)0x0 || (mattk->adtyp == '#')))))) {
        if ((int)local_33 == 1 - local_34) {
          magr_local._4_4_ = 1;
        }
        else {
          magr_local._4_4_ = 0;
          if (ppStack_30->mlet == '\x0e') {
            magr_local._4_4_ = 2;
          }
        }
      }
      else {
        magr_local._4_4_ = 0;
      }
    }
    else {
      magr_local._4_4_ = 0;
    }
  }
  else {
    magr_local._4_4_ = 0;
  }
  return magr_local._4_4_;
}

Assistant:

int could_seduce(struct monst *magr, struct monst *mdef, const struct attack *mattk)
/* returns 0 if seduction impossible,
 *	   1 if fine,
 *	   2 if wrong gender for nymph */
{
	const struct permonst *pagr;
	boolean agrinvis, defperc;
	xchar genagr, gendef;

	if (is_animal(magr->data)) return 0;
	if (magr == &youmonst) {
		pagr = youmonst.data;
		agrinvis = (Invis != 0);
		genagr = poly_gender();
	} else {
		pagr = magr->data;
		agrinvis = magr->minvis;
		genagr = gender(magr);
	}
	if (mdef == &youmonst) {
		defperc = (See_invisible != 0);
		gendef = poly_gender();
	} else {
		defperc = perceives(mdef->data);
		gendef = gender(mdef);
	}

	if (agrinvis && !defperc && mattk && mattk->adtyp != AD_SSEX)
		return 0;

	if (pagr->mlet != S_NYMPH
		&& ((pagr != &mons[PM_INCUBUS] && pagr != &mons[PM_SUCCUBUS])
		    || (mattk && mattk->adtyp != AD_SSEX) ))
		return 0;
	
	if (genagr == 1 - gendef)
		return 1;
	else
		return (pagr->mlet == S_NYMPH) ? 2 : 0;
}